

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArcSineDifferentiationTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  double extraout_XMM0_Qa;
  Variable x;
  Variable local_b0;
  Expression local_98;
  ArcSineExpression local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  double local_28;
  
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_b0._vptr_Variable = (_func_int **)&PTR_differentiate_001156d0;
  local_b0.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_b0.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_b0.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_98,(double *)&local_68);
  (local_b0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       0.5;
  Kandinsky::asin<Kandinsky::Variable,_nullptr>(&local_80,&local_b0);
  Kandinsky::BaseExpression::differentiate(&local_98,(BaseExpression *)&local_80,&local_b0);
  (**(local_98.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  local_28 = extraout_XMM0_Qa;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_68,vsnprintf,0x148,"%f",0x3ff279a74590331d);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x111030);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_38 = *plVar3;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar3;
    local_48 = (long *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (ABS(local_28 + -1.1547005383792517) < 0.0001) {
    if (local_48 != &local_38) {
      operator_delete(local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_98._vptr_Expression = (_func_int **)&PTR_variables_001156f8;
    if (local_98.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_80.super_UnaryExpression.super_BaseExpression._vptr_BaseExpression =
         (_func_int **)&PTR___cxa_pure_virtual_00115508;
    if (local_80.super_UnaryExpression.m_arg.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super_UnaryExpression.m_arg.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_b0._vptr_Variable = (_func_int **)&PTR_differentiate_001156d0;
    if (local_b0.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return 0;
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_48,local_40);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(0.5);
    assertOrExit(std::abs((asin(x)).differentiate(x).evaluate() - 1. /  std::sqrt(1. - 0.5 * 0.5)) < 1.e-4, "x = 0.5; d(asin(x))/dx != " + std::to_string(1. / std::sqrt(1. - 0.5 * 0.5)));
    return 0;
}